

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::GetFilenameLastExtension
                   (string *__return_storage_ptr__,string *filename)

{
  allocator local_51;
  undefined4 local_50;
  long local_40;
  size_type dot_pos;
  string name;
  string *filename_local;
  
  name.field_2._8_8_ = filename;
  GetFilenameName((string *)&dot_pos,filename);
  local_40 = std::__cxx11::string::rfind((char)&dot_pos,0x2e);
  if (local_40 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&dot_pos);
  }
  local_50 = 1;
  std::__cxx11::string::~string((string *)&dot_pos);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetFilenameLastExtension(const std::string& filename)
{
  std::string name = SystemTools::GetFilenameName(filename);
  std::string::size_type dot_pos = name.rfind('.');
  if(dot_pos != std::string::npos)
    {
    return name.substr(dot_pos);
    }
  else
    {
    return "";
    }
}